

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

void writeRgbaWithPreview2(char *fileName,int width,int height)

{
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  int iVar1;
  int iVar2;
  Rgba *pRVar3;
  PreviewRgba *pPVar4;
  Array2D<Imf_3_2::PreviewRgba> *this;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  PreviewRgba *outPixel;
  Rgba *inPixel;
  int x;
  int y;
  RgbaOutputFile file;
  Header header;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  int previewHeight;
  int previewWidth;
  int N;
  Array<Imf_3_2::Rgba> pixels;
  half *in_stack_fffffffffffffee0;
  char *pcVar6;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Array<Imf_3_2::Rgba> *in_stack_ffffffffffffff20;
  Vec2<float> *this_00;
  long in_stack_ffffffffffffff28;
  Array2D<Imf_3_2::PreviewRgba> *in_stack_ffffffffffffff30;
  int local_c8;
  int local_c4;
  Rgba local_c0 [3];
  PreviewImage local_a8 [16];
  Vec2<float> local_98;
  PreviewImage local_90 [72];
  Array2D<Imf_3_2::PreviewRgba> local_48;
  uint local_2c;
  uint local_28;
  undefined4 local_24;
  Array local_20 [16];
  int local_10;
  int local_c;
  char *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_3_2::Array<Imf_3_2::Rgba>::Array
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  local_24 = 8;
  iVar1 = local_c;
  if (local_c < 0) {
    iVar1 = local_c + 7;
  }
  local_28 = iVar1 >> 3;
  iVar1 = local_10;
  if (local_10 < 0) {
    iVar1 = local_10 + 7;
  }
  local_2c = iVar1 >> 3;
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::Array2D
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(long)in_stack_ffffffffffffff20);
  this_00 = &local_98;
  iVar1 = local_c;
  iVar2 = local_10;
  Imath_3_2::Vec2<float>::Vec2(this_00,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_90,iVar1,iVar2,this_00,0,3);
  Imf_3_2::PreviewImage::PreviewImage(local_a8,local_28,local_2c,(PreviewRgba *)0x0);
  Imf_3_2::Header::setPreviewImage(local_90);
  Imf_3_2::PreviewImage::~PreviewImage(local_a8);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_c0,local_8,(Header *)local_90,WRITE_RGBA,iVar1);
  pRVar3 = Imf_3_2::Array::operator_cast_to_Rgba_(local_20);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_c0,(ulong)pRVar3,1);
  pcVar6 = local_8;
  for (local_c4 = 0; local_c4 < local_10; local_c4 = local_c4 + 1) {
    drawImage7((Array<Imf_3_2::Rgba> *)CONCAT44(iVar1,in_stack_ffffffffffffff10),
               (int)((ulong)pcVar6 >> 0x20),(int)pcVar6,(int)((ulong)pRVar3 >> 0x20));
    Imf_3_2::RgbaOutputFile::writePixels((int)local_c0);
    if (local_c4 % 8 == 0) {
      for (local_c8 = 0; local_c8 < local_c; local_c8 = local_c8 + 8) {
        Imf_3_2::Array::operator_cast_to_Rgba_(local_20);
        iVar2 = local_c4;
        if (local_c4 < 0) {
          iVar2 = local_c4 + 7;
        }
        pPVar4 = Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[](&local_48,(long)(iVar2 >> 3));
        iVar2 = local_c8;
        if (local_c8 < 0) {
          iVar2 = local_c8 + 7;
        }
        pPVar4 = pPVar4 + (iVar2 >> 3);
        fVar5 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffee0);
        gamma((double)CONCAT44(extraout_XMM0_Db,fVar5));
        pPVar4->r = extraout_AL;
        fVar5 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffee0);
        gamma((double)CONCAT44(extraout_XMM0_Db_00,fVar5));
        pPVar4->g = extraout_AL_00;
        fVar5 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffee0);
        gamma((double)CONCAT44(extraout_XMM0_Db_01,fVar5));
        pPVar4->b = extraout_AL_01;
        fVar5 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffee0);
        fVar5 = Imath_3_2::clamp<float>(fVar5 * 255.0,0.0,255.0);
        pPVar4->a = (uchar)(int)(fVar5 + 0.5);
      }
    }
  }
  this = (Array2D<Imf_3_2::PreviewRgba> *)
         Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[](&local_48,0);
  Imf_3_2::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_c0);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_c0);
  Imf_3_2::Header::~Header((Header *)local_90);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::~Array2D(this);
  Imf_3_2::Array<Imf_3_2::Rgba>::~Array((Array<Imf_3_2::Rgba> *)this);
  return;
}

Assistant:

void
writeRgbaWithPreview2 (const char fileName[], int width, int height)
{
    //
    // Write an image file with a preview image, version 2:
    //
    // - generate a file header
    // - add a dummy preview image to the file header
    // - open the file (this stores the header with the dummy
    //   preview image in the file)
    // - render the main image's pixels one scan line at a time,
    //   and store each scan line in the file before rendering
    //   the next scan line
    // - generate the preview image on the fly, while the main
    //   image is being rendered
    // - once the main image has been rendered, store the preview
    //   image in the file, overwriting the dummy preview
    //

    Array<Rgba> pixels (width);

    const int N = 8;

    int                  previewWidth  = width / N;
    int                  previewHeight = height / N;
    Array2D<PreviewRgba> previewPixels (previewHeight, previewWidth);

    Header header (width, height);
    header.setPreviewImage (PreviewImage (previewWidth, previewHeight));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, 0);

    for (int y = 0; y < height; ++y)
    {
        drawImage7 (pixels, width, height, y);
        file.writePixels (1);

        if (y % N == 0)
        {
            for (int x = 0; x < width; x += N)
            {
                const Rgba&  inPixel  = pixels[x];
                PreviewRgba& outPixel = previewPixels[y / N][x / N];

                outPixel.r = gamma (inPixel.r);
                outPixel.g = gamma (inPixel.g);
                outPixel.b = gamma (inPixel.b);
                outPixel.a = int (
                    IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) +
                    0.5f);
            }
        }
    }

    file.updatePreviewImage (&previewPixels[0][0]);
}